

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

String * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (String *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision,PrecisionType precisionType)

{
  size_type sVar1;
  uint uVar2;
  String *extraout_RAX;
  pointer pcVar3;
  String *pSVar4;
  pointer pcVar5;
  pointer pcVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  size_type sVar8;
  char *__format;
  allocator<char> local_31;
  double local_30;
  
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_30 = value;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'$');
    __format = "%.*f";
    if (precision == 0) {
      __format = "%.*g";
    }
    while( true ) {
      uVar2 = snprintf((__return_storage_ptr__->_M_dataplus)._M_p,
                       __return_storage_ptr__->_M_string_length,__format,local_30,
                       CONCAT71(in_register_00000011,useSpecialFloats) & 0xffffffff);
      if ((int)uVar2 < 0) {
        __assert_fail("len >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/springkim[P]cip/src/jsoncpp.cpp"
                      ,0x1057,
                      "String Json::(anonymous namespace)::valueToString(double, bool, unsigned int, PrecisionType)"
                     );
      }
      if ((ulong)uVar2 < __return_storage_ptr__->_M_string_length) break;
      std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar2 + '\x01');
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar2);
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar1 = __return_storage_ptr__->_M_string_length;
    pcVar5 = pcVar3;
    if (sVar1 != 0) {
      pcVar5 = pcVar3 + sVar1;
      sVar8 = 0;
      do {
        if (pcVar3[sVar8] == ',') {
          pcVar3[sVar8] = '.';
        }
        sVar8 = sVar8 + 1;
      } while (sVar1 != sVar8);
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    }
    __return_storage_ptr__->_M_string_length = (long)pcVar5 - (long)pcVar3;
    *pcVar5 = '\0';
    if (precision == 1) {
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar1 = __return_storage_ptr__->_M_string_length;
      pcVar5 = pcVar3 + sVar1;
      pcVar6 = pcVar5;
      if (sVar1 != 0) {
        do {
          sVar8 = sVar1;
          pcVar6 = pcVar5;
          if ((pcVar3[sVar8 - 1] != '0') || (pcVar6 = pcVar3, sVar8 == 1)) goto LAB_001128a0;
          pcVar5 = pcVar5 + -1;
          sVar1 = sVar8 - 1;
        } while (pcVar3[sVar8 - 2] != '.');
        pcVar6 = pcVar3 + sVar8;
      }
LAB_001128a0:
      __return_storage_ptr__->_M_string_length = (long)pcVar6 - (long)pcVar3;
      *pcVar6 = '\0';
    }
    pSVar4 = (String *)std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
    if ((pSVar4 == (String *)0xffffffffffffffff) &&
       (pSVar4 = (String *)std::__cxx11::string::find((char)__return_storage_ptr__,0x65),
       pSVar4 == (String *)0xffffffffffffffff)) {
      pSVar4 = (String *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    uVar7 = 0;
    if (!NAN(value)) {
      uVar7 = (ulong)((0.0 <= value) + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               anon_unknown_17::valueToString::reps[(byte)((byte)this ^ 1)][uVar7],&local_31);
    pSVar4 = extraout_RAX;
  }
  return pSVar4;
}

Assistant:

String valueToString(double value, bool useSpecialFloats,
                     unsigned int precision, PrecisionType precisionType) {
  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distinguish the
  // concepts of reals and integers.
  if (!isfinite(value)) {
    static const char* const reps[2][3] = {{"NaN", "-Infinity", "Infinity"},
                                           {"null", "-1e+9999", "1e+9999"}};
    return reps[useSpecialFloats ? 0 : 1]
               [isnan(value) ? 0 : (value < 0) ? 1 : 2];
  }

  String buffer(size_t(36), '\0');
  while (true) {
    int len = jsoncpp_snprintf(
        &*buffer.begin(), buffer.size(),
        (precisionType == PrecisionType::significantDigits) ? "%.*g" : "%.*f",
        precision, value);
    assert(len >= 0);
    auto wouldPrint = static_cast<size_t>(len);
    if (wouldPrint >= buffer.size()) {
      buffer.resize(wouldPrint + 1);
      continue;
    }
    buffer.resize(wouldPrint);
    break;
  }

  buffer.erase(fixNumericLocale(buffer.begin(), buffer.end()), buffer.end());

  // strip the zero padding from the right
  if (precisionType == PrecisionType::decimalPlaces) {
    buffer.erase(fixZerosInTheEnd(buffer.begin(), buffer.end()), buffer.end());
  }

  // try to ensure we preserve the fact that this was given to us as a double on
  // input
  if (buffer.find('.') == buffer.npos && buffer.find('e') == buffer.npos) {
    buffer += ".0";
  }
  return buffer;
}